

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

bool llvm::ARM::getExtensionFeatures
               (uint Extensions,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  pointer *ppSVar1;
  iterator iVar2;
  bool bVar3;
  StringRef local_20;
  
  if (Extensions != 0) {
    if ((Extensions & 2) == 0) {
      local_20.Data = "-crc";
    }
    else {
      local_20.Data = "+crc";
    }
    local_20.Length = 4;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 4;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    if ((Extensions >> 10 & 1) == 0) {
      local_20.Data = "-dsp";
    }
    else {
      local_20.Data = "+dsp";
    }
    local_20.Length = 4;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 4;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    if ((Extensions >> 0xc & 1) == 0) {
      local_20.Data = "-ras";
    }
    else {
      local_20.Data = "+ras";
    }
    local_20.Length = 4;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 4;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    if ((Extensions >> 0xe & 1) == 0) {
      local_20.Data = "-dotprod";
    }
    else {
      local_20.Data = "+dotprod";
    }
    local_20.Length = 8;
    iVar2._M_current =
         (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
      _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
    }
    else {
      (iVar2._M_current)->Data = local_20.Data;
      (iVar2._M_current)->Length = 8;
      ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    bVar3 = getHWDivFeatures(Extensions,Features);
    return bVar3;
  }
  return false;
}

Assistant:

bool llvm::ARM::getExtensionFeatures(unsigned Extensions,
                                     std::vector<StringRef> &Features) {

  if (Extensions == ARM::AEK_INVALID)
    return false;

  if (Extensions & ARM::AEK_CRC)
    Features.push_back("+crc");
  else
    Features.push_back("-crc");

  if (Extensions & ARM::AEK_DSP)
    Features.push_back("+dsp");
  else
    Features.push_back("-dsp");

  if (Extensions & ARM::AEK_RAS)
    Features.push_back("+ras");
  else
    Features.push_back("-ras");

  if (Extensions & ARM::AEK_DOTPROD)
    Features.push_back("+dotprod");
  else
    Features.push_back("-dotprod");

  return getHWDivFeatures(Extensions, Features);
}